

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int changeTempStorage(Parse *pParse,char *zStorageType)

{
  sqlite3 *psVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  
  bVar2 = *zStorageType;
  bVar5 = bVar2 - 0x30;
  if (2 < bVar5) {
    lVar4 = 0;
    bVar5 = bVar2;
    do {
      if (bVar5 == "parse - fills database with entries from a file"[lVar4 + 0x2b]) {
        if (bVar5 == 0) goto LAB_001ba245;
      }
      else if (""[bVar5] !=
               ""[(byte)"parse - fills database with entries from a file"[lVar4 + 0x2b]]) {
        lVar4 = 0;
        goto LAB_001ba255;
      }
      bVar5 = zStorageType[lVar4 + 1];
      lVar4 = lVar4 + 1;
    } while( true );
  }
LAB_001ba283:
  psVar1 = pParse->db;
  bVar2 = psVar1->temp_store;
  uVar3 = (uint)bVar2;
  if ((bVar5 != bVar2) && (uVar3 = invalidateTempStorage(pParse), uVar3 == 0)) {
    psVar1->temp_store = bVar5;
  }
  return uVar3;
LAB_001ba255:
  if (bVar2 == "failed to allocate %u bytes of memory"[lVar4 + 0x1f]) {
    if (bVar2 == 0) goto LAB_001ba27a;
  }
  else if (""[bVar2] != ""[(byte)"failed to allocate %u bytes of memory"[lVar4 + 0x1f]]) {
    bVar5 = 0;
    goto LAB_001ba283;
  }
  bVar2 = zStorageType[lVar4 + 1];
  lVar4 = lVar4 + 1;
  goto LAB_001ba255;
LAB_001ba27a:
  bVar5 = 2;
  goto LAB_001ba283;
LAB_001ba245:
  bVar5 = 1;
  goto LAB_001ba283;
}

Assistant:

static int changeTempStorage(Parse *pParse, const char *zStorageType){
  int ts = getTempStore(zStorageType);
  sqlite3 *db = pParse->db;
  if( db->temp_store==ts ) return SQLITE_OK;
  if( invalidateTempStorage( pParse ) != SQLITE_OK ){
    return SQLITE_ERROR;
  }
  db->temp_store = (u8)ts;
  return SQLITE_OK;
}